

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

PipeThread *
capnp::_::anon_unknown_0::runServer
          (PipeThread *__return_storage_ptr__,AsyncIoProvider *ioProvider,int *callCount,
          int *handleCount)

{
  long *plVar1;
  
  plVar1 = (long *)operator_new(0x18);
  *plVar1 = (long)&PTR_operator___006e7a00;
  plVar1[1] = (long)callCount;
  plVar1[2] = (long)handleCount;
  (*ioProvider->_vptr_AsyncIoProvider[4])(__return_storage_ptr__,ioProvider);
  if (plVar1 != (long *)0x0) {
    kj::_::
    HeapDisposer<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:77:7)>_>
    ::disposeImpl((HeapDisposer<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:77:7)>_>
                   *)&kj::_::
                      HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runServer(kj::AsyncIoProvider&,int&,int&)::$_0>>
                      ::instance,(void *)((long)plVar1 + *(long *)(*plVar1 + -0x10)));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::AsyncIoProvider::PipeThread runServer(kj::AsyncIoProvider& ioProvider,
                                          int& callCount, int& handleCount) {
  return ioProvider.newPipeThread(
      [&callCount, &handleCount](
       kj::AsyncIoProvider& ioProvider, kj::AsyncIoStream& stream, kj::WaitScope& waitScope) {
    TwoPartyVatNetwork network(stream, rpc::twoparty::Side::SERVER);
    auto server = makeRpcServer(network, kj::heap<TestInterfaceImpl>(callCount, handleCount));
    network.onDisconnect().wait(waitScope);
  });
}